

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::~GeometryShaderMaxOutputComponentsTest
          (GeometryShaderMaxOutputComponentsTest *this)

{
  ~GeometryShaderMaxOutputComponentsTest(this);
  operator_delete(this,0x378);
  return;
}

Assistant:

virtual ~GeometryShaderMaxOutputComponentsTest()
	{
	}